

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  GLFWwindow *pGVar5;
  int value;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  float *pfVar9;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 auStack_58 [5];
  
  iVar4 = 0;
  do {
    value = iVar4;
    iVar3 = getopt(argc,argv,"bh");
    iVar4 = 1;
  } while (iVar3 == 0x62);
  if (iVar3 == -1) {
    glfwSetErrorCallback(error_callback);
    iVar4 = glfwInit();
    if (iVar4 == 0) goto LAB_00113ce7;
    glfwWindowHint(0x20005,value);
    uVar8 = 0;
    glfwWindowHint(0x20004,0);
    piVar7 = &titles_rel;
    pfVar9 = &colors[0].b;
    do {
      pGVar5 = glfwCreateWindow(200,200,(char *)((long)&titles_rel + (long)*piVar7),
                                (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      auStack_58[uVar8] = pGVar5;
      if (pGVar5 == (GLFWwindow *)0x0) {
        glfwTerminate();
        goto LAB_00113ce7;
      }
      glfwSetKeyCallback(pGVar5,key_callback);
      glfwMakeContextCurrent(pGVar5);
      gladLoadGLLoader(glfwGetProcAddress);
      (*glad_glClearColor)(((anon_struct_12_3_4e92c811 *)(pfVar9 + -2))->r,pfVar9[-1],*pfVar9,1.0);
      glfwGetWindowFrameSize(pGVar5,&local_5c,&local_60,&local_64,&local_68);
      iVar4 = local_5c + local_64 + 300;
      if ((uVar8 & 1) == 0) {
        iVar4 = 100;
      }
      glfwSetWindowPos(pGVar5,iVar4,
                       (local_68 + local_60 + 200) * ((uint)(uVar8 >> 1) & 0x7fffffff) + 100);
      uVar8 = uVar8 + 1;
      piVar7 = piVar7 + 1;
      pfVar9 = pfVar9 + 3;
    } while (uVar8 != 4);
    lVar6 = 0;
    do {
      glfwShowWindow((GLFWwindow *)auStack_58[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar6 = 0;
    bVar2 = true;
    do {
      do {
        bVar1 = bVar2;
        pGVar5 = (GLFWwindow *)auStack_58[lVar6];
        glfwMakeContextCurrent(pGVar5);
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(pGVar5);
        iVar4 = glfwWindowShouldClose(pGVar5);
        if (iVar4 != 0) {
          bVar1 = false;
        }
        lVar6 = lVar6 + 1;
        bVar2 = bVar1;
      } while (lVar6 != 4);
      glfwWaitEvents();
      lVar6 = 0;
      bVar2 = true;
    } while (bVar1);
    glfwTerminate();
  }
  else {
    if (iVar3 != 0x68) {
      usage();
LAB_00113ce7:
      exit(1);
    }
    usage();
  }
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    int i, ch;
    int decorated = GLFW_FALSE;
    int running = GLFW_TRUE;
    GLFWwindow* windows[4];

    while ((ch = getopt(argc, argv, "bh")) != -1)
    {
        switch (ch)
        {
            case 'b':
                decorated = GLFW_TRUE;
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_DECORATED, decorated);
    glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
        glClearColor(colors[i].r, colors[i].g, colors[i].b, 1.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GLFW_FALSE;
        }

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}